

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRandomBernoulliStaticLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  undefined1 *puVar2;
  Result *_result;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  validateInputCount(__return_storage_ptr__,layer,0,0);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
      if (layer->_oneof_case_[0] == 0x4bf) {
        puVar2 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar2 = Specification::_RandomBernoulliStaticLayerParams_default_instance_;
      }
      if ((((ConvolutionLayerParams *)puVar2)->kernelsize_).current_size_ == 0) {
        std::operator+(&local_38,"Target shape is required parameter for \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&err,&local_38,"\' layer.");
        std::__cxx11::string::~string((string *)&local_38);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      }
      else {
        if ((0.0 <= ((RandomNormalStaticLayerParams *)puVar2)->mean_) &&
           (((RandomNormalStaticLayerParams *)puVar2)->mean_ <= 1.0)) {
          Result::Result(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        std::operator+(&local_38,"Value of prob should be in range [0: 1] for \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&err,&local_38,"\' layer.");
        std::__cxx11::string::~string((string *)&local_38);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      }
      std::__cxx11::string::~string((string *)&err);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRandomBernoulliStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 0, 0));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    const auto& params = layer.randombernoullistatic();
    if (params.outputshape_size() == 0) {
        const std::string err = "Target shape is required parameter for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.prob() < 0.0f || params.prob() > 1.0f) {
        const std::string err = "Value of prob should be in range [0: 1] for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}